

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Receiver_PDU::Receiver_PDU
          (Receiver_PDU *this,EntityIdentifier *ID,KUINT16 RadioID,TransmitState TS,
          KFLOAT32 ReceivingPower,EntityIdentifier *TransmitterID,KUINT16 TransmitterRadioID)

{
  KUINT16 TransmitterRadioID_local;
  EntityIdentifier *TransmitterID_local;
  KFLOAT32 ReceivingPower_local;
  TransmitState TS_local;
  KUINT16 RadioID_local;
  EntityIdentifier *ID_local;
  Receiver_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,ID,RadioID);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Receiver_PDU_0032ba00;
  *(short *)&(this->super_Radio_Communications_Header).field_0x3a = (short)TS;
  *(undefined2 *)&(this->super_Radio_Communications_Header).field_0x3c = 0;
  this->m_f32RecPwr = ReceivingPower;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TransmitterEntityID,TransmitterID);
  this->m_ui16TransmitterRadioID = TransmitterRadioID;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1b';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x24;
  return;
}

Assistant:

Receiver_PDU::Receiver_PDU( const EntityIdentifier & ID, KUINT16 RadioID, TransmitState TS,
                            KFLOAT32 ReceivingPower, const EntityIdentifier & TransmitterID,
                            KUINT16 TransmitterRadioID ) :
    Radio_Communications_Header( ID, RadioID ),
    m_ui16ReceiverState( TS ),
    m_ui16Padding1( 0 ),
    m_f32RecPwr( ReceivingPower ),
    m_TransmitterEntityID( TransmitterID ),
    m_ui16TransmitterRadioID( TransmitterRadioID )
{
    m_ui8PDUType = Receiver_PDU_Type;
    m_ui16PDULength = RECEIVER_PDU_SIZE;
}